

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datrie.c
# Opt level: O0

size_t dictionary_datrie_get_all_match_lengths
                 (dictionary_t t_dictionary,ucs4_t *word,size_t *match_length)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int j;
  int k;
  size_t p;
  size_t i;
  size_t rscnt;
  datrie_dictionary_desc *datrie_dictionary;
  size_t *match_length_local;
  ucs4_t *word_local;
  dictionary_t t_dictionary_local;
  
  i = 0;
  p = 0;
  _j = 0;
  while( true ) {
    bVar3 = false;
    if (word[_j] != 0) {
      bVar3 = *(int *)(*t_dictionary + p * 0xc) != -1;
    }
    if (!bVar3) {
      return i;
    }
    iVar1 = encode_char(word[_j]);
    uVar2 = *(int *)(*t_dictionary + p * 0xc) + iVar1;
    if ((int)uVar2 < 0) {
      return i;
    }
    if (*(uint *)((long)t_dictionary + 8) <= uVar2) break;
    if ((long)*(int *)(*t_dictionary + (long)(int)uVar2 * 0xc + 4) != p) {
      return i;
    }
    p = (size_t)(int)uVar2;
    if (*(int *)(*t_dictionary + p * 0xc + 8) != -1) {
      match_length[i] = _j + 1;
      i = i + 1;
    }
    _j = _j + 1;
  }
  return i;
}

Assistant:

size_t dictionary_datrie_get_all_match_lengths(dictionary_t t_dictionary, const ucs4_t * word,
		size_t * match_length)
{
	datrie_dictionary_desc * datrie_dictionary = (datrie_dictionary_desc *) t_dictionary;

	size_t rscnt = 0;

	size_t i, p;
	for (i = 0,p = 0; word[p] && datrie_dictionary->dat[i].base != DATRIE_UNUSED; p ++)
	{
		int k = encode_char(word[p]);
		int j = datrie_dictionary->dat[i].base + k;
		if (j < 0 || j >= datrie_dictionary->dat_item_count || datrie_dictionary->dat[j].parent != i)
			break;
		i = j;

		if (datrie_dictionary->dat[i].word != -1)
			match_length[rscnt ++] = p + 1;
	}

	return rscnt;
}